

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

bool Js::RegexHelper::IsRegexSymbolMatchObservable
               (RecyclableObject *instance,ScriptContext *scriptContext)

{
  DynamicObject *regexPrototype;
  bool bVar1;
  
  regexPrototype =
       (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       regexPrototype.ptr;
  bVar1 = JavascriptRegExp::HasOriginalRegExType(instance);
  if (bVar1) {
    bVar1 = JavascriptRegExp::HasObservableExec(regexPrototype);
    if (!bVar1) {
      bVar1 = JavascriptRegExp::HasObservableGlobalFlag(regexPrototype);
      if (!bVar1) {
        bVar1 = JavascriptRegExp::HasObservableUnicodeFlag(regexPrototype);
        return bVar1;
      }
    }
  }
  return true;
}

Assistant:

bool RegexHelper::IsRegexSymbolMatchObservable(RecyclableObject* instance, ScriptContext* scriptContext)
    {
        DynamicObject* regexPrototype = scriptContext->GetLibrary()->GetRegExpPrototype();
        return !JavascriptRegExp::HasOriginalRegExType(instance)
            || JavascriptRegExp::HasObservableExec(regexPrototype)
            || JavascriptRegExp::HasObservableGlobalFlag(regexPrototype)
            || JavascriptRegExp::HasObservableUnicodeFlag(regexPrototype);
    }